

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O2

void TestDoubleToFixed(void)

{
  bool bVar1;
  undefined1 in_CL;
  undefined1 uVar2;
  char *in_R8;
  char *value_source;
  int in_R9D;
  undefined4 in_register_0000008c;
  StringBuilder local_260;
  DoubleToStringConverter local_248;
  DoubleToStringConverter local_218;
  DoubleToStringConverter local_1e8;
  DoubleToStringConverter local_1b8;
  DoubleToStringConverter local_188;
  DoubleToStringConverter local_158;
  DoubleToStringConverter local_128;
  DoubleToStringConverter local_f8;
  DoubleToStringConverter local_c8;
  char buffer [128];
  char *pcVar3;
  
  local_260.buffer_.start_ = buffer;
  local_260.buffer_.length_ = 0x80;
  local_260.position_ = 0;
  local_248.flags_ = 9;
  local_248.infinity_symbol_ = "Infinity";
  local_248.nan_symbol_ = "NaN";
  local_248.exponent_character_ = 'e';
  local_248.decimal_in_shortest_low_ = 0;
  local_248.decimal_in_shortest_high_ = 0;
  local_248.max_leading_padding_zeroes_in_precision_mode_ = 0;
  local_248.max_trailing_padding_zeroes_in_precision_mode_ = 0;
  local_248.min_exponent_width_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,0.0,0,&local_260);
  CheckHelper((char *)0x1c1,0xc0edba,(char *)(ulong)bVar1,(bool)in_CL);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x1c2,0xc08054,"0",local_260.buffer_.start_,in_R8,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,-0.0,0,&local_260);
  CheckHelper((char *)0x1c5,0xc0edd7,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x1c6,0xc08054,"0",local_260.buffer_.start_,in_R8,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,-0.0,1,&local_260);
  CheckHelper((char *)0x1c9,0xc0edf5,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x1ca,0xc0ee13,"0.0",local_260.buffer_.start_,in_R8,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,-0.0,1,&local_260);
  CheckHelper((char *)0x1cd,0xc0edf5,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x1ce,0xc0ee13,"0.0",local_260.buffer_.start_,in_R8,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,0.0,0x3c,&local_260);
  CheckHelper((char *)0x1d4,0xc0ee19,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x1d6,0xc0ee68,
                    "0.000000000000000000000000000000000000000000000000000000000000",
                    local_260.buffer_.start_,in_R8,(char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,9e+59,0x3c,&local_260);
  CheckHelper((char *)0x1da,0xc0eee8,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x1dd,0xc0ef38,
                    "899999999999999918767229449717619953810131273674690656206848.000000000000000000000000000000000000000000000000000000000000"
                    ,local_260.buffer_.start_,in_R8,(char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,-9e+59,0x3c,&local_260);
  CheckHelper((char *)0x1e1,0xc0efb7,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x1e4,0xc0f008,
                    "-899999999999999918767229449717619953810131273674690656206848.000000000000000000000000000000000000000000000000000000000000"
                    ,local_260.buffer_.start_,in_R8,(char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,1e+60,0x3c,&local_260);
  CheckHelper((char *)0x1e8,0xc0f103,(char *)(ulong)!bVar1,(bool)uVar2);
  uVar2 = 0x54;
  CheckEqualsHelper((char *)0x1e9,0xc1672f,(char *)0x0,0xc0f154,
                    (char *)(ulong)(uint)local_260.position_,in_R9D);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,9e+59,0x3d,&local_260);
  CheckHelper((char *)0x1ed,0xc0f167,(char *)(ulong)!bVar1,(bool)uVar2);
  value_source = (char *)(ulong)(uint)local_260.position_;
  uVar2 = 0x54;
  CheckEqualsHelper((char *)0x1ee,0xc1672f,(char *)0x0,0xc0f154,value_source,in_R9D);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,3.0,0,&local_260);
  CheckHelper((char *)0x1f1,0xc0f1bc,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x1f2,0xc0f1d9,"3",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,3.23,1,&local_260);
  CheckHelper((char *)0x1f5,0xc0f1dd,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x1f6,0xc0f1fb,"3.2",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,3.23,3,&local_260);
  CheckHelper((char *)0x1f9,0xc0f201,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x1fa,0xc0f21f,"3.230",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,0.0323,2,&local_260);
  CheckHelper((char *)0x1fd,0xc0f22d,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x1fe,0xc0f24d,"0.03",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,0.0373,2,&local_260);
  CheckHelper((char *)0x201,0xc0f259,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x202,0xc0f279,"0.04",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,3.73e-05,2,&local_260);
  CheckHelper((char *)0x205,0xc0f285,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x206,0xc0f2a8,"0.00",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,1.5,0,&local_260);
  CheckHelper((char *)0x209,0xc0f2af,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x20a,0xc08162,"2",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,2.5,0,&local_260);
  CheckHelper((char *)0x20d,0xc0f2cc,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x20e,0xc0f1d9,"3",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,3.5,0,&local_260);
  CheckHelper((char *)0x211,0xc0f2e9,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x212,0xc0c694,"4",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,0.15,1,&local_260);
  CheckHelper((char *)0x215,0xc0f306,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x216,0xc0e3a9,"0.1",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,0.25,1,&local_260);
  CheckHelper((char *)0x219,0xc0f324,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x21a,0xc0f342,"0.3",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,0.35,1,&local_260);
  CheckHelper((char *)0x21d,0xc0f34c,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x21e,0xc0f342,"0.3",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,0.45,1,&local_260);
  CheckHelper((char *)0x221,0xc0f36a,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x222,0xc0f388,"0.5",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,0.55,1,&local_260);
  CheckHelper((char *)0x225,0xc0f392,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x226,0xc0f3b0,"0.6",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_c8.flags_ = 1;
  local_c8.infinity_symbol_ = "Infinity";
  local_c8.nan_symbol_ = "NaN";
  local_c8.exponent_character_ = 'e';
  local_c8.min_exponent_width_ = 0;
  local_c8.decimal_in_shortest_low_ = 0;
  local_c8.decimal_in_shortest_high_ = 0;
  local_c8.max_leading_padding_zeroes_in_precision_mode_ = 0;
  local_c8.max_trailing_padding_zeroes_in_precision_mode_ = 0;
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_c8,0.0,1,&local_260);
  CheckHelper((char *)0x22d,0xc0f3ba,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x22e,0xc0ee13,"0.0",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_c8,-0.0,1,&local_260);
  CheckHelper((char *)0x231,0xc0f3d8,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x232,0xc0f3f7,"-0.0",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_158.flags_ = 3;
  local_158.infinity_symbol_ = "Infinity";
  local_158.nan_symbol_ = "NaN";
  local_158.exponent_character_ = 'e';
  local_158.min_exponent_width_ = 0;
  local_158.decimal_in_shortest_low_ = 0;
  local_158.decimal_in_shortest_high_ = 0;
  local_158.max_leading_padding_zeroes_in_precision_mode_ = 0;
  local_158.max_trailing_padding_zeroes_in_precision_mode_ = 0;
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_158,0.0,0,&local_260);
  CheckHelper((char *)0x23a,0xc0f403,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x23b,0xc0f421,"0.",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_158,-0.0,0,&local_260);
  CheckHelper((char *)0x23e,0xc0f426,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x23f,0xc0f445,"-0.",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_158,1.0,0,&local_260);
  CheckHelper((char *)0x242,0xc0f44f,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x243,0xc0f46d,"1.",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_158,-1.0,0,&local_260);
  CheckHelper((char *)0x246,0xc0f472,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x247,0xc0f491,"-1.",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_188.flags_ = 7;
  local_188.infinity_symbol_ = "Infinity";
  local_188.nan_symbol_ = "NaN";
  local_188.exponent_character_ = 'e';
  local_188.min_exponent_width_ = 0;
  local_188.decimal_in_shortest_low_ = 0;
  local_188.decimal_in_shortest_high_ = 0;
  local_188.max_leading_padding_zeroes_in_precision_mode_ = 0;
  local_188.max_trailing_padding_zeroes_in_precision_mode_ = 0;
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_188,0.0,0,&local_260);
  CheckHelper((char *)0x251,0xc0f49b,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x252,0xc0ee13,"0.0",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_188,-0.0,0,&local_260);
  CheckHelper((char *)0x255,0xc0f4b9,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x256,0xc0f3f7,"-0.0",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_188,1.0,0,&local_260);
  CheckHelper((char *)0x259,0xc0f4d8,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x25a,0xc0e481,"1.0",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_188,-1.0,0,&local_260);
  CheckHelper((char *)0x25d,0xc0f4f6,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x25e,0xc0f515,"-1.0",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_218.flags_ = 0;
  local_218.infinity_symbol_ = (char *)0x0;
  local_218.nan_symbol_ = (char *)0x0;
  local_218.exponent_character_ = 'e';
  local_218.min_exponent_width_ = 0;
  local_218.decimal_in_shortest_low_ = 0;
  local_218.decimal_in_shortest_high_ = 0;
  local_218.max_leading_padding_zeroes_in_precision_mode_ = 0;
  local_218.max_trailing_padding_zeroes_in_precision_mode_ = 0;
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_218,3.12,1,&local_260);
  CheckHelper((char *)0x265,0xc0f521,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x266,0xc0f540,"3.1",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_218,3.1415,3,&local_260);
  CheckHelper((char *)0x269,0xc0f54a,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x26a,0xc0f56b,"3.142",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_218,1234.56789,4,&local_260);
  CheckHelper((char *)0x26d,0xc0f579,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x26e,0xc0f59e,"1234.5679",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_218,1.23,5,&local_260);
  CheckHelper((char *)0x271,0xc0f5b4,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x272,0xc0f5d3,"1.23000",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_218,0.1,4,&local_260);
  CheckHelper((char *)0x275,0xc0f5e5,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x276,0xc0f603,"0.1000",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_218,1e+30,2,&local_260);
  CheckHelper((char *)0x279,0xc0f613,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x27a,0xc0f632,"1000000000000000019884624838656.00",
                    local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_218,0.1,0x1e,&local_260);
  CheckHelper((char *)0x27d,0xc0f67a,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x27e,0xc0f699,"0.100000000000000005551115123126",
                    local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_218,0.1,0x11,&local_260);
  CheckHelper((char *)0x281,0xc0f6dd,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x282,0xc0f6fc,"0.10000000000000001",local_260.buffer_.start_,
                    value_source,(char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_218,123.45,0,&local_260);
  CheckHelper((char *)0x285,0xc0f726,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x286,0xc0f747,"123",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_218,0.678,0,&local_260);
  CheckHelper((char *)0x289,0xc0f74d,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x28a,0xc080e4,"1",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_f8.flags_ = 2;
  local_f8.infinity_symbol_ = (char *)0x0;
  local_f8.nan_symbol_ = (char *)0x0;
  local_f8.exponent_character_ = 'e';
  local_f8.min_exponent_width_ = 0;
  local_f8.decimal_in_shortest_low_ = 0;
  local_f8.decimal_in_shortest_high_ = 0;
  local_f8.max_leading_padding_zeroes_in_precision_mode_ = 0;
  local_f8.max_trailing_padding_zeroes_in_precision_mode_ = 0;
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_f8,123.45,0,&local_260);
  CheckHelper((char *)0x290,0xc0f76d,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x291,0xc0f78e,"123.",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_f8,0.678,0,&local_260);
  CheckHelper((char *)0x294,0xc0f79a,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x295,0xc0f46d,"1.",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_128.flags_ = 6;
  local_128.infinity_symbol_ = (char *)0x0;
  local_128.nan_symbol_ = (char *)0x0;
  local_128.exponent_character_ = 'e';
  local_128.min_exponent_width_ = 0;
  local_128.decimal_in_shortest_low_ = 0;
  local_128.decimal_in_shortest_high_ = 0;
  local_128.max_leading_padding_zeroes_in_precision_mode_ = 0;
  local_128.max_trailing_padding_zeroes_in_precision_mode_ = 0;
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_128,123.45,0,&local_260);
  CheckHelper((char *)0x29c,0xc0f7ba,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x29d,0xc0f7db,"123.0",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_128,0.678,0,&local_260);
  CheckHelper((char *)0x2a0,0xc0f7e9,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x2a1,0xc0e481,"1.0",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_1b8.flags_ = 6;
  local_1b8.infinity_symbol_ = (char *)0x0;
  local_1b8.nan_symbol_ = (char *)0x0;
  local_1b8.exponent_character_ = 'e';
  local_1b8.min_exponent_width_ = 0;
  local_1b8.decimal_in_shortest_low_ = 0;
  local_1b8.decimal_in_shortest_high_ = 0;
  local_1b8.max_leading_padding_zeroes_in_precision_mode_ = 0;
  local_1b8.max_trailing_padding_zeroes_in_precision_mode_ = 0;
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_1b8,INFINITY,1,&local_260);
  CheckHelper((char *)0x2a7,0xc0f809,(char *)(ulong)!bVar1,(bool)uVar2);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_1b8,-INFINITY,1,&local_260);
  CheckHelper((char *)0x2aa,0xc0f837,(char *)(ulong)!bVar1,(bool)uVar2);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_1b8,NAN,1,&local_260);
  CheckHelper((char *)0x2ad,0xc0f866,(char *)(ulong)!bVar1,(bool)uVar2);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_1b8,-NAN,1,&local_260);
  CheckHelper((char *)0x2b0,0xc0f88f,(char *)(ulong)!bVar1,(bool)uVar2);
  local_1e8.flags_ = 6;
  local_1e8.infinity_symbol_ = "Infinity";
  local_1e8.nan_symbol_ = "NaN";
  local_1e8.exponent_character_ = 'e';
  local_1e8.decimal_in_shortest_low_ = 0;
  local_1e8.decimal_in_shortest_high_ = 0;
  local_1e8.max_leading_padding_zeroes_in_precision_mode_ = 0;
  local_1e8.max_trailing_padding_zeroes_in_precision_mode_ = 0;
  local_1e8.min_exponent_width_ = 0;
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_1e8,INFINITY,1,&local_260);
  CheckHelper((char *)0x2b5,0xc0f8b9,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x2b6,0xc0e6b5,"Infinity",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_1e8,-INFINITY,1,&local_260);
  CheckHelper((char *)0x2b9,0xc0f8e6,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x2ba,0xc0e6ee,"-Infinity",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_1e8,NAN,1,&local_260);
  CheckHelper((char *)0x2bd,0xc0f914,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  pcVar3 = local_260.buffer_.start_;
  CheckEqualsHelper((char *)0x2be,0xc0e72c,"NaN",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = SUB81(pcVar3,0);
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_1e8,-NAN,1,&local_260);
  CheckHelper((char *)0x2c1,0xc0f93c,(char *)(ulong)bVar1,(bool)uVar2);
  local_260.buffer_.start_[local_260.position_] = '\0';
  local_260.position_ = -1;
  CheckEqualsHelper((char *)0x2c2,0xc0e72c,"NaN",local_260.buffer_.start_,value_source,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  if (-1 < (long)local_260.position_) {
    local_260.buffer_.start_[local_260.position_] = '\0';
  }
  return;
}

Assistant:

TEST(DoubleToFixed) {
  const int kBufferSize = 128;
  char buffer[kBufferSize];
  StringBuilder builder(buffer, kBufferSize);
  int flags = DoubleToStringConverter::EMIT_POSITIVE_EXPONENT_SIGN |
      DoubleToStringConverter::UNIQUE_ZERO;
  DoubleToStringConverter dc(flags, "Infinity", "NaN", 'e',
                             0, 0, 0, 0);  // Padding zeroes.

  CHECK(dc.ToFixed(0.0, 0, &builder));
  CHECK_EQ("0", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(-0.0, 0, &builder));
  CHECK_EQ("0", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(-0.0, 1, &builder));
  CHECK_EQ("0.0", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(-0.0, 1, &builder));
  CHECK_EQ("0.0", builder.Finalize());

  DOUBLE_CONVERSION_ASSERT(DoubleToStringConverter::kMaxFixedDigitsBeforePoint == 60);
  DOUBLE_CONVERSION_ASSERT(DoubleToStringConverter::kMaxFixedDigitsAfterPoint == 60);
  builder.Reset();
  CHECK(dc.ToFixed(
      0.0, DoubleToStringConverter::kMaxFixedDigitsAfterPoint, &builder));
  CHECK_EQ("0.000000000000000000000000000000000000000000000000000000000000",
           builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(
      9e59, DoubleToStringConverter::kMaxFixedDigitsAfterPoint, &builder));
  CHECK_EQ("899999999999999918767229449717619953810131273674690656206848."
           "000000000000000000000000000000000000000000000000000000000000",
           builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(
      -9e59, DoubleToStringConverter::kMaxFixedDigitsAfterPoint, &builder));
  CHECK_EQ("-899999999999999918767229449717619953810131273674690656206848."
           "000000000000000000000000000000000000000000000000000000000000",
           builder.Finalize());

  builder.Reset();
  CHECK(!dc.ToFixed(
      1e60, DoubleToStringConverter::kMaxFixedDigitsAfterPoint, &builder));
  CHECK_EQ(0, builder.position());

  builder.Reset();
  CHECK(!dc.ToFixed(
      9e59, DoubleToStringConverter::kMaxFixedDigitsAfterPoint + 1, &builder));
  CHECK_EQ(0, builder.position());

  builder.Reset();
  CHECK(dc.ToFixed(3.0, 0, &builder));
  CHECK_EQ("3", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(3.23, 1, &builder));
  CHECK_EQ("3.2", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(3.23, 3, &builder));
  CHECK_EQ("3.230", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(0.0323, 2, &builder));
  CHECK_EQ("0.03", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(0.0373, 2, &builder));
  CHECK_EQ("0.04", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(0.0000373, 2, &builder));
  CHECK_EQ("0.00", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(1.5, 0, &builder));
  CHECK_EQ("2", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(2.5, 0, &builder));
  CHECK_EQ("3", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(3.5, 0, &builder));
  CHECK_EQ("4", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(0.15, 1, &builder));
  CHECK_EQ("0.1", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(0.25, 1, &builder));
  CHECK_EQ("0.3", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(0.35, 1, &builder));
  CHECK_EQ("0.3", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(0.45, 1, &builder));
  CHECK_EQ("0.5", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(0.55, 1, &builder));
  CHECK_EQ("0.6", builder.Finalize());

  // Test positive/negative zeroes.
  int flags2 = DoubleToStringConverter::EMIT_POSITIVE_EXPONENT_SIGN;
  DoubleToStringConverter dc2(flags2, "Infinity", "NaN", 'e',
                              0, 0, 0, 0);  // Padding zeroes.
  builder.Reset();
  CHECK(dc2.ToFixed(0.0, 1, &builder));
  CHECK_EQ("0.0", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToFixed(-0.0, 1, &builder));
  CHECK_EQ("-0.0", builder.Finalize());

  // Verify the trailing dot is emitted.
  int flags3 = DoubleToStringConverter::EMIT_POSITIVE_EXPONENT_SIGN |
      DoubleToStringConverter::EMIT_TRAILING_DECIMAL_POINT;
  DoubleToStringConverter dc3(flags3, "Infinity", "NaN", 'e',
                              0, 0, 0, 0);  // Padding zeroes.
  builder.Reset();
  CHECK(dc3.ToFixed(0.0, 0, &builder));
  CHECK_EQ("0.", builder.Finalize());

  builder.Reset();
  CHECK(dc3.ToFixed(-0.0, 0, &builder));
  CHECK_EQ("-0.", builder.Finalize());

  builder.Reset();
  CHECK(dc3.ToFixed(1.0, 0, &builder));
  CHECK_EQ("1.", builder.Finalize());

  builder.Reset();
  CHECK(dc3.ToFixed(-1.0, 0, &builder));
  CHECK_EQ("-1.", builder.Finalize());

  // Verify no trailing zero is emitted, even if the configuration is set.
  // The given parameter takes precedence.
  int flags4 = DoubleToStringConverter::EMIT_POSITIVE_EXPONENT_SIGN |
      DoubleToStringConverter::EMIT_TRAILING_DECIMAL_POINT |
      DoubleToStringConverter::EMIT_TRAILING_ZERO_AFTER_POINT;
  DoubleToStringConverter dc4(flags4, "Infinity", "NaN", 'e',
                              0, 0, 0, 0);  // Padding zeroes.
  builder.Reset();
  CHECK(dc4.ToFixed(0.0, 0, &builder));
  CHECK_EQ("0.0", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToFixed(-0.0, 0, &builder));
  CHECK_EQ("-0.0", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToFixed(1.0, 0, &builder));
  CHECK_EQ("1.0", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToFixed(-1.0, 0, &builder));
  CHECK_EQ("-1.0", builder.Finalize());

  // Test the examples in the comments of ToFixed.
  flags = DoubleToStringConverter::NO_FLAGS;
  DoubleToStringConverter dc5(flags, NULL, NULL, 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(dc5.ToFixed(3.12, 1, &builder));
  CHECK_EQ("3.1", builder.Finalize());

  builder.Reset();
  CHECK(dc5.ToFixed(3.1415, 3, &builder));
  CHECK_EQ("3.142", builder.Finalize());

  builder.Reset();
  CHECK(dc5.ToFixed(1234.56789, 4, &builder));
  CHECK_EQ("1234.5679", builder.Finalize());

  builder.Reset();
  CHECK(dc5.ToFixed(1.23, 5, &builder));
  CHECK_EQ("1.23000", builder.Finalize());

  builder.Reset();
  CHECK(dc5.ToFixed(0.1, 4, &builder));
  CHECK_EQ("0.1000", builder.Finalize());

  builder.Reset();
  CHECK(dc5.ToFixed(1e30, 2, &builder));
  CHECK_EQ("1000000000000000019884624838656.00", builder.Finalize());

  builder.Reset();
  CHECK(dc5.ToFixed(0.1, 30, &builder));
  CHECK_EQ("0.100000000000000005551115123126", builder.Finalize());

  builder.Reset();
  CHECK(dc5.ToFixed(0.1, 17, &builder));
  CHECK_EQ("0.10000000000000001", builder.Finalize());

  builder.Reset();
  CHECK(dc5.ToFixed(123.45, 0, &builder));
  CHECK_EQ("123", builder.Finalize());

  builder.Reset();
  CHECK(dc5.ToFixed(0.678, 0, &builder));
  CHECK_EQ("1", builder.Finalize());

  flags = DoubleToStringConverter::EMIT_TRAILING_DECIMAL_POINT;
  DoubleToStringConverter dc6(flags, NULL, NULL, 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(dc6.ToFixed(123.45, 0, &builder));
  CHECK_EQ("123.", builder.Finalize());

  builder.Reset();
  CHECK(dc6.ToFixed(0.678, 0, &builder));
  CHECK_EQ("1.", builder.Finalize());

  flags = DoubleToStringConverter::EMIT_TRAILING_DECIMAL_POINT |
      DoubleToStringConverter::EMIT_TRAILING_ZERO_AFTER_POINT;
  DoubleToStringConverter dc7(flags, NULL, NULL, 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(dc7.ToFixed(123.45, 0, &builder));
  CHECK_EQ("123.0", builder.Finalize());

  builder.Reset();
  CHECK(dc7.ToFixed(0.678, 0, &builder));
  CHECK_EQ("1.0", builder.Finalize());

  // Test special value handling.
  DoubleToStringConverter dc8(flags, NULL, NULL, 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(!dc8.ToFixed(Double::Infinity(), 1, &builder));

  builder.Reset();
  CHECK(!dc8.ToFixed(-Double::Infinity(), 1, &builder));

  builder.Reset();
  CHECK(!dc8.ToFixed(Double::NaN(), 1, &builder));

  builder.Reset();
  CHECK(!dc8.ToFixed(-Double::NaN(), 1, &builder));

  DoubleToStringConverter dc9(flags, "Infinity", "NaN", 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(dc9.ToFixed(Double::Infinity(), 1, &builder));
  CHECK_EQ("Infinity", builder.Finalize());

  builder.Reset();
  CHECK(dc9.ToFixed(-Double::Infinity(), 1, &builder));
  CHECK_EQ("-Infinity", builder.Finalize());

  builder.Reset();
  CHECK(dc9.ToFixed(Double::NaN(), 1, &builder));
  CHECK_EQ("NaN", builder.Finalize());

  builder.Reset();
  CHECK(dc9.ToFixed(-Double::NaN(), 1, &builder));
  CHECK_EQ("NaN", builder.Finalize());
}